

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiletime_evaluation.cpp
# Opt level: O0

void operations_test<viennamath::ct_variable<0ul>,viennamath::ct_variable<0ul>>
               (ct_variable<0UL> *t,ct_variable<0UL> *u,double t2,double u2)

{
  ostream *poVar1;
  ct_variable<0UL> *extraout_RDX;
  ct_variable<0UL> *extraout_RDX_00;
  ct_variable<0UL> *rhs;
  ct_variable<0UL> *rhs_00;
  ct_constant<1L> local_3f [2];
  ct_constant<1L> local_3d [3];
  ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>
  local_3a [2];
  ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>
  local_36;
  ct_constant<0L> local_33 [2];
  ct_constant<0L> local_31 [3];
  ct_binary_expr<viennamath::ct_constant<2L>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>
  local_2e [2];
  ct_binary_expr<viennamath::ct_constant<2L>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>
  local_2a;
  double local_28;
  double u2_local;
  double t2_local;
  ct_variable<0UL> *u_local;
  ct_variable<0UL> *t_local;
  
  local_28 = u2;
  u2_local = t2;
  t2_local = (double)u;
  u_local = t;
  poVar1 = std::operator<<((ostream *)&std::cout,"LHS: ");
  poVar1 = viennamath::operator<<(poVar1,u_local);
  poVar1 = std::operator<<(poVar1,", RHS: ");
  poVar1 = viennamath::operator<<(poVar1,(ct_variable<0UL> *)t2_local);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  viennamath::operator+
            ((ct_binary_expr<viennamath::ct_constant<2L>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>
              *)u_local,(ct_variable<0UL> *)t2_local,extraout_RDX);
  evaluations_test<viennamath::ct_binary_expr<viennamath::ct_constant<2l>,viennamath::op_mult<double>,viennamath::ct_variable<0ul>>>
            (&local_2a,u2_local + local_28);
  viennamath::operator+
            ((ct_binary_expr<viennamath::ct_constant<2L>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>
              *)t2_local,u_local,extraout_RDX_00);
  evaluations_test<viennamath::ct_binary_expr<viennamath::ct_constant<2l>,viennamath::op_mult<double>,viennamath::ct_variable<0ul>>>
            (local_2e,local_28 + u2_local);
  viennamath::operator-(u_local,(ct_variable<0UL> *)t2_local);
  evaluations_test<viennamath::ct_constant<0l>>(local_31,u2_local - local_28);
  viennamath::operator-((ct_variable<0UL> *)t2_local,u_local);
  evaluations_test<viennamath::ct_constant<0l>>(local_33,local_28 - u2_local);
  viennamath::operator*((type *)u_local,(ct_variable<0UL> *)t2_local,rhs);
  evaluations_test<viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_mult<double>,viennamath::ct_variable<0ul>>>
            (&local_36,u2_local * local_28);
  viennamath::operator*((type *)t2_local,u_local,rhs_00);
  evaluations_test<viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_mult<double>,viennamath::ct_variable<0ul>>>
            (local_3a,local_28 * u2_local);
  viennamath::operator/(u_local,(ct_variable<0UL> *)t2_local);
  evaluations_test<viennamath::ct_constant<1l>>(local_3d,u2_local / local_28);
  viennamath::operator/((ct_variable<0UL> *)t2_local,u_local);
  evaluations_test<viennamath::ct_constant<1l>>(local_3f,local_28 / u2_local);
  return;
}

Assistant:

void operations_test(T const & t, U const & u, double t2, double u2)
{
  std::cout << "LHS: " << t << ", RHS: " << u << std::endl;
  evaluations_test(t + u, t2 + u2);
  evaluations_test(u + t, u2 + t2);
  evaluations_test(t - u, t2 - u2);
  evaluations_test(u - t, u2 - t2);
  evaluations_test(t * u, t2 * u2);
  evaluations_test(u * t, u2 * t2);
  evaluations_test(t / u, t2 / u2);
  evaluations_test(u / t, u2 / t2);
}